

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O1

int __thiscall QPDF::getExtensionLevel(QPDF *this)

{
  Members *pMVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  int iVar7;
  QPDFObjectHandle obj;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68 [32];
  QPDFObjectHandle local_48;
  undefined1 local_38 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  getRoot((QPDF *)local_98);
  local_88._M_allocated_capacity = (size_type)&local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_98 + 0x10),"/Extensions","");
  bVar6 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_98,(string *)(local_98 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_allocated_capacity != &local_78) {
    operator_delete((void *)local_88._M_allocated_capacity,local_78._M_allocated_capacity + 1);
  }
  if (bVar6) {
    local_88._M_allocated_capacity = (size_type)&local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_98 + 0x10),"/Extensions","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_68,(string *)local_98);
    uVar3 = local_68._8_8_;
    local_98._0_8_ = local_68._0_8_;
    uVar2 = local_98._8_8_;
    local_68._0_8_ = (Members *)0x0;
    local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98._8_8_ = uVar3;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_allocated_capacity != &local_78) {
      operator_delete((void *)local_88._M_allocated_capacity,local_78._M_allocated_capacity + 1);
    }
    bVar6 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_98);
    if (bVar6) {
      local_88._M_allocated_capacity = (size_type)&local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_98 + 0x10),"/ADBE","");
      bVar6 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_98,(string *)(local_98 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_allocated_capacity != &local_78) {
        operator_delete((void *)local_88._M_allocated_capacity,local_78._M_allocated_capacity + 1);
      }
    }
    else {
      bVar6 = false;
    }
    if (bVar6 != false) {
      pMVar1 = (Members *)(local_68 + 0x10);
      local_68._0_8_ = pMVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"/ADBE","");
      QPDFObjectHandle::getKey(&local_48,(string *)local_98);
      _Var4._M_pi = local_48.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_98._0_8_ =
           local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      uVar2 = local_98._8_8_;
      local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98._8_8_ = _Var4._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
      }
      if (local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((Members *)local_68._0_8_ != pMVar1) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      bVar6 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_98);
      if (bVar6) {
        local_68._0_8_ = pMVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"/ExtensionLevel","");
        bVar6 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_98,(string *)local_68);
        if ((Members *)local_68._0_8_ != pMVar1) {
          operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        }
      }
      else {
        bVar6 = false;
      }
      iVar7 = 0;
      if (bVar6 != false) {
        local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_38;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"/ExtensionLevel","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_38 + 0x10),(string *)local_98);
        p_Var5 = p_Stack_20;
        local_98._0_8_ = local_38._16_8_;
        uVar2 = local_98._8_8_;
        local_38._16_8_ = (Members *)0x0;
        p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_98._8_8_ = p_Var5;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        }
        if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
        }
        if ((Members *)
            local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (Members *)local_38) {
          operator_delete(local_48.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          (ulong)((long)&(((shared_ptr<QPDFLogger::Members> *)local_38._0_8_)->
                                         super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + 1));
        }
        bVar6 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_98);
        if (bVar6) {
          iVar7 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_98);
        }
      }
      goto LAB_0013d175;
    }
  }
  iVar7 = 0;
LAB_0013d175:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  return iVar7;
}

Assistant:

int
QPDF::getExtensionLevel()
{
    int result = 0;
    QPDFObjectHandle obj = getRoot();
    if (obj.hasKey("/Extensions")) {
        obj = obj.getKey("/Extensions");
        if (obj.isDictionary() && obj.hasKey("/ADBE")) {
            obj = obj.getKey("/ADBE");
            if (obj.isDictionary() && obj.hasKey("/ExtensionLevel")) {
                obj = obj.getKey("/ExtensionLevel");
                if (obj.isInteger()) {
                    result = obj.getIntValueAsInt();
                }
            }
        }
    }
    return result;
}